

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

uint __thiscall
Memory::HeapBlockMap64::Rescan(HeapBlockMap64 *this,Recycler *recycler,bool resetWriteWatch)

{
  uint uVar1;
  Node *local_28;
  Node *node;
  uint scannedPageCount;
  bool resetWriteWatch_local;
  Recycler *recycler_local;
  HeapBlockMap64 *this_local;
  
  node._0_4_ = 0;
  for (local_28 = this->list; local_28 != (Node *)0x0; local_28 = local_28->next) {
    uVar1 = HeapBlockMap32::Rescan(&local_28->map,recycler,resetWriteWatch);
    node._0_4_ = uVar1 + (uint)node;
  }
  return (uint)node;
}

Assistant:

uint
HeapBlockMap64::Rescan(Recycler * recycler, bool resetWriteWatch)
{
    uint scannedPageCount = 0;

    Node * node = this->list;
    while (node != nullptr)
    {
        scannedPageCount += node->map.Rescan(recycler, resetWriteWatch);
        node = node->next;
    }

    return scannedPageCount;
}